

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenTest.cpp
# Opt level: O0

void __thiscall UnitTest1::CodeGenTest::DryParserGenTest1(CodeGenTest *this)

{
  uint64_t uVar1;
  void *pvVar2;
  char *__stat_loc;
  StringLogger *in_stack_fffffffffffff850;
  char local_768 [8];
  char msg [256];
  uint64_t end_time;
  uint64_t start_time;
  Stage1Runner runner;
  stat st;
  char *input_path;
  DryParserEM64T<unsigned_char> parser;
  StringLogger logger;
  undefined1 local_108 [8];
  Grammar<unsigned_char> grammar;
  CodeGenTest *this_local;
  
  grammar.m_options.
  super_unordered_map<Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)this;
  LoadGrammar<unsigned_char>((Grammar<unsigned_char> *)local_108,"../../grammar/json2.cgr");
  Centaurus::Grammar<unsigned_char>::optimize((Grammar<unsigned_char> *)local_108);
  asmjit::StringLogger::StringLogger(in_stack_fffffffffffff850);
  Centaurus::DryParserEM64T<unsigned_char>::DryParserEM64T
            ((DryParserEM64T<unsigned_char> *)&input_path,(Grammar<unsigned_char> *)local_108,
             (Logger *)parser.m_code._namedLabels.super_ZoneHashBase._embedded);
  stat("../../datasets/citylots.json",
       (stat *)&runner.result_chunks_.
                super__Vector_base<Centaurus::detail::ConstPtrRange<Centaurus::CSTMarker>,_std::allocator<Centaurus::detail::ConstPtrRange<Centaurus::CSTMarker>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __stat_loc = "../../datasets/citylots.json";
  Centaurus::Stage1Runner::Stage1Runner
            ((Stage1Runner *)&start_time,"../../datasets/citylots.json",(IParser *)&input_path,
             0x800000,8,false,false);
  uVar1 = get_us_clock();
  Centaurus::Stage1Runner::start((Stage1Runner *)&start_time);
  Centaurus::BaseRunner::wait((BaseRunner *)&start_time,__stat_loc);
  msg._248_8_ = get_us_clock();
  sprintf(local_768,"Elapsed time: %lu[ms]\r\n",(msg._248_8_ - uVar1) / 1000);
  Microsoft::VisualStudio::CppUnitTestFramework::Logger::WriteMessage(local_768);
  sprintf(local_768,"Throughput: %lu[MB/s]\r\n",st.st_rdev / (msg._248_8_ - uVar1));
  Microsoft::VisualStudio::CppUnitTestFramework::Logger::WriteMessage(local_768);
  pvVar2 = Centaurus::Stage1Runner::get_result((Stage1Runner *)&start_time);
  Microsoft::VisualStudio::CppUnitTestFramework::Assert::IsTrue
            (pvVar2 != (void *)0x0,(wchar_t *)0x0);
  Centaurus::Stage1Runner::~Stage1Runner((Stage1Runner *)&start_time);
  Centaurus::DryParserEM64T<unsigned_char>::~DryParserEM64T
            ((DryParserEM64T<unsigned_char> *)&input_path);
  asmjit::StringLogger::~StringLogger(in_stack_fffffffffffff850);
  Centaurus::Grammar<unsigned_char>::~Grammar((Grammar<unsigned_char> *)local_108);
  return;
}

Assistant:

TEST_METHOD(DryParserGenTest1)
    {
        using namespace Centaurus;

        Grammar<unsigned char> grammar = LoadGrammar<unsigned char>("../../grammar/json2.cgr");
        //Grammar<unsigned char> grammar = LoadGrammar<unsigned char>("grammar/xml.cgr");

		grammar.optimize();

		/*FILE *logFile;
		fopen_s(&logFile, "parser.asm", "w");
        asmjit::FileLogger logger(logFile);*/

        asmjit::StringLogger logger;
		
        DryParserEM64T<unsigned char> parser(grammar, &logger);

        //std::cout << logger.getString() << std::endl;

		//fclose(logFile);

        //Logger::WriteMessage(logger.getString());

        //MappedFileInput json("/home/ihara/Downloads/sf-city-lots-json-master/citylots.json");

#if defined(CENTAURUS_BUILD_WINDOWS)
		const char *input_path = "..\\..\\datasets\\citylots.json";
		//const char *input_path = "test2.json";
#elif defined(CENTAURUS_BUILD_LINUX)
        const char *input_path = "../../datasets/citylots.json";
#endif
        struct stat st;
        stat(input_path, &st);

        Stage1Runner runner{input_path, &parser, 8 * 1024 * 1024, 8};

		uint64_t start_time = get_us_clock();

        runner.start();
        runner.wait();

		uint64_t end_time = get_us_clock();

		char msg[256];
		sprintf(msg, "Elapsed time: %lu[ms]\r\n", (end_time - start_time) / 1000);
		Logger::WriteMessage(msg);

        sprintf(msg, "Throughput: %lu[MB/s]\r\n", st.st_size / (end_time - start_time));
        Logger::WriteMessage(msg);

        //Assert::AreEqual((const void *)(json + strlen(json)), context.result);
        Assert::IsTrue(runner.get_result() != NULL);

        //_aligned_free(json);
    }